

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rrb_transient.h
# Opt level: O0

ref<immutable::rrb_details::internal_node<int,_true>_> *
immutable::rrb_details::new_editable_path<int,true,5>
          (ref<immutable::rrb_details::internal_node<int,_true>_> *to_set,uint32_t empty_height,
          guid_type guid)

{
  internal_node<int,_true> *piVar1;
  ref<immutable::rrb_details::internal_node<int,_true>_> local_40;
  ref<immutable::rrb_details::internal_node<int,_true>_> new_empty;
  uint32_t i;
  ref<immutable::rrb_details::internal_node<int,_true>_> empty;
  internal_node<int,_true> *leaf;
  guid_type guid_local;
  uint32_t empty_height_local;
  ref<immutable::rrb_details::internal_node<int,_true>_> *to_set_local;
  
  to_set_local = to_set;
  if (empty_height != 0) {
    empty.ptr = transient_internal_node_create<int,true,5>();
    (empty.ptr)->guid = guid;
    (empty.ptr)->len = 1;
    ref<immutable::rrb_details::internal_node<int,_true>_>::ref
              ((ref<immutable::rrb_details::internal_node<int,_true>_> *)&stack0xffffffffffffffd0,
               empty.ptr);
    for (new_empty.ptr._4_4_ = 1; new_empty.ptr._4_4_ < empty_height;
        new_empty.ptr._4_4_ = new_empty.ptr._4_4_ + 1) {
      piVar1 = transient_internal_node_create<int,true,5>();
      ref<immutable::rrb_details::internal_node<int,_true>_>::ref(&local_40,piVar1);
      piVar1 = ref<immutable::rrb_details::internal_node<int,_true>_>::operator->(&local_40);
      piVar1->len = 1;
      piVar1 = ref<immutable::rrb_details::internal_node<int,_true>_>::operator->(&local_40);
      piVar1->guid = guid;
      piVar1 = ref<immutable::rrb_details::internal_node<int,_true>_>::operator->(&local_40);
      ref<immutable::rrb_details::internal_node<int,_true>_>::operator=
                (piVar1->child,
                 (ref<immutable::rrb_details::internal_node<int,_true>_> *)&stack0xffffffffffffffd0)
      ;
      ref<immutable::rrb_details::internal_node<int,_true>_>::operator=
                ((ref<immutable::rrb_details::internal_node<int,_true>_> *)&stack0xffffffffffffffd0,
                 &local_40);
      ref<immutable::rrb_details::internal_node<int,_true>_>::~ref(&local_40);
    }
    ref<immutable::rrb_details::internal_node<int,_true>_>::operator=
              (to_set,(ref<immutable::rrb_details::internal_node<int,_true>_> *)
                      &stack0xffffffffffffffd0);
    to_set_local = (empty.ptr)->child;
    ref<immutable::rrb_details::internal_node<int,_true>_>::~ref
              ((ref<immutable::rrb_details::internal_node<int,_true>_> *)&stack0xffffffffffffffd0);
  }
  return to_set_local;
}

Assistant:

inline ref<internal_node<T, atomic_ref_counting>>* new_editable_path(ref<internal_node<T, atomic_ref_counting>>* to_set, uint32_t empty_height, guid_type guid)
      {
      if (0 < empty_height)
        {
        internal_node<T, atomic_ref_counting>* leaf = transient_internal_node_create<T, atomic_ref_counting, N>();
        leaf->guid = guid;
        leaf->len = 1;

        ref<internal_node<T, atomic_ref_counting>> empty = leaf;
        for (uint32_t i = 1; i < empty_height; i++)
          {
          ref<internal_node<T, atomic_ref_counting>> new_empty = transient_internal_node_create<T, atomic_ref_counting, N>();
          new_empty->len = 1;
          new_empty->guid = guid;
          new_empty->child[0] = empty;
          empty = new_empty;
          }
        *to_set = empty;
        return &leaf->child[0];
        }
      else
        {
        return to_set;
        }
      }